

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_downscaleStats(uint *table,U32 lastEltIndex,U32 shift,base_directive_e base1)

{
  uint local_30;
  uint newStat;
  uint base;
  U32 sum;
  U32 s;
  base_directive_e base1_local;
  U32 shift_local;
  U32 lastEltIndex_local;
  uint *table_local;
  
  newStat = 0;
  if (shift < 0x1e) {
    for (base = 0; base < lastEltIndex + 1; base = base + 1) {
      if (base1 == base_0possible) {
        local_30 = (uint)(table[base] != 0);
      }
      else {
        local_30 = 1;
      }
      local_30 = local_30 + (table[base] >> ((byte)shift & 0x1f));
      newStat = local_30 + newStat;
      table[base] = local_30;
    }
    return newStat;
  }
  __assert_fail("shift < 30",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                ,0x6b,"U32 ZSTD_downscaleStats(unsigned int *, U32, U32, base_directive_e)");
}

Assistant:

static U32
ZSTD_downscaleStats(unsigned* table, U32 lastEltIndex, U32 shift, base_directive_e base1)
{
    U32 s, sum=0;
    DEBUGLOG(5, "ZSTD_downscaleStats (nbElts=%u, shift=%u)",
            (unsigned)lastEltIndex+1, (unsigned)shift );
    assert(shift < 30);
    for (s=0; s<lastEltIndex+1; s++) {
        unsigned const base = base1 ? 1 : (table[s]>0);
        unsigned const newStat = base + (table[s] >> shift);
        sum += newStat;
        table[s] = newStat;
    }
    return sum;
}